

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg-covreach.cc
# Opt level: O1

tuple<tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>_>
* tchecker::tck_reach::zg_covreach::run
            (tuple<tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>_>
             *__return_storage_ptr__,system_declaration_t *sysdecl,string *labels,
            string *search_order,covering_t covering,size_t block_size,size_t table_size)

{
  bool bVar1;
  policy_t policy;
  system_t *this;
  ostream *poVar2;
  graph_t *this_00;
  invalid_argument *this_01;
  algorithm_t algorithm;
  shared_ptr<tchecker::zg::zg_t> zg;
  shared_ptr<const_tchecker::ta::system_t> system;
  stats_t stats;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> accepting_labels;
  algorithm_t<tchecker::zg::zg_t,_tchecker::tck_reach::zg_covreach::graph_t> local_101;
  graph_t *local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  shared_ptr<tchecker::zg::zg_t> local_f0;
  shared_ptr<const_tchecker::ta::system_t> local_e0;
  string *local_d0;
  stats_t local_c8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  stats_t local_68;
  
  local_d0 = search_order;
  this = (system_t *)operator_new(0x480);
  ta::system_t::system_t(this,sysdecl);
  local_e0.super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::ta::system_t*>
            (&local_e0.super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this);
  bVar1 = tchecker::system::every_process_has_initial_location
                    ((system_t *)
                     local_e0.
                     super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (!bVar1) {
    poVar2 = tchecker::operator<<((ostream *)&std::cerr,(log_warning_t *)&log_warning);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"system has no initial state",0x1b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  local_f0.super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       tchecker::zg::factory
                 (&local_e0,SHARING,ELAPSED_SEMANTICS,EXTRA_LU_PLUS_LOCAL,block_size,table_size);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::zg::zg_t*>
            (&local_f0.super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             local_f0.super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this_00 = (graph_t *)operator_new(0x108);
  graph_t::graph_t(this_00,&local_f0,block_size,table_size);
  local_100 = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::tck_reach::zg_covreach::graph_t*>(&local_f8,this_00);
  syncprod::system_t::labels
            (&local_88,
             &(local_e0.super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_system_t,labels);
  policy = algorithms::fast_remove_waiting_policy(local_d0);
  algorithms::covreach::stats_t::stats_t(&local_c8);
  if (covering == COVERING_LEAF_NODES) {
    algorithms::covreach::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_reach::zg_covreach::graph_t>
    ::run<(tchecker::algorithms::covreach::covering_t)1>
              (&local_68,&local_101,
               local_f0.super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               local_100,&local_88,policy);
  }
  else {
    if (covering != COVERING_FULL) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_01,"Unknown covering policy for covreach algorithm");
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    algorithms::covreach::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_reach::zg_covreach::graph_t>
    ::run<(tchecker::algorithms::covreach::covering_t)0>
              (&local_68,&local_101,
               local_f0.super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               local_100,&local_88,policy);
  }
  local_c8._reachable = local_68._reachable;
  local_c8._covered_states = local_68._covered_states;
  local_c8._stored_states = local_68._stored_states;
  local_c8._visited_states = local_68._visited_states;
  local_c8._visited_transitions = local_68._visited_transitions;
  local_c8.super_stats_t._start_time.__d.__r = local_68.super_stats_t._start_time.__d.__r;
  local_c8.super_stats_t._end_time.__d.__r = local_68.super_stats_t._end_time.__d.__r;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>_>
  ).super__Tuple_impl<1UL,_std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>_>.
  super__Head_base<1UL,_std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>,_false>.
  _M_head_impl.
  super___shared_ptr<tchecker::tck_reach::zg_covreach::graph_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_100;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>_>
  ).super__Tuple_impl<1UL,_std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>_>.
  super__Head_base<1UL,_std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>,_false>.
  _M_head_impl.
  super___shared_ptr<tchecker::tck_reach::zg_covreach::graph_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_f8._M_pi;
  if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_f8._M_pi)->_M_use_count = (local_f8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_f8._M_pi)->_M_use_count = (local_f8._M_pi)->_M_use_count + 1;
    }
  }
  *(ulong *)&(__return_storage_ptr__->
             super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>_>
             ).super__Head_base<0UL,_tchecker::algorithms::covreach::stats_t,_false>._M_head_impl.
             _reachable = CONCAT71(local_c8._49_7_,local_68._reachable);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::covreach::stats_t,_false>._M_head_impl.
  _covered_states = local_68._covered_states;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::covreach::stats_t,_false>._M_head_impl.
  _stored_states = local_68._stored_states;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::covreach::stats_t,_false>._M_head_impl.
  _visited_states = local_68._visited_states;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::covreach::stats_t,_false>._M_head_impl.
  _visited_transitions = local_68._visited_transitions;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::covreach::stats_t,_false>._M_head_impl.super_stats_t
  ._start_time.__d.__r = (rep)local_68.super_stats_t._start_time.__d.__r;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::covreach::stats_t,_false>._M_head_impl.super_stats_t
  ._end_time.__d.__r = (rep)local_68.super_stats_t._end_time.__d.__r;
  bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                    (&local_88);
  if (bVar1) {
    if (local_88.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
    }
    if (local_f0.super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f0.super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_e0.super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.
                 super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",0x2be,
                "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

std::tuple<tchecker::algorithms::covreach::stats_t, std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t>>
run(tchecker::parsing::system_declaration_t const & sysdecl, std::string const & labels, std::string const & search_order,
    tchecker::algorithms::covreach::covering_t covering, std::size_t block_size, std::size_t table_size)
{
  std::shared_ptr<tchecker::ta::system_t const> system{new tchecker::ta::system_t{sysdecl}};
  if (!tchecker::system::every_process_has_initial_location(system->as_system_system()))
    std::cerr << tchecker::log_warning << "system has no initial state" << std::endl;

  std::shared_ptr<tchecker::zg::zg_t> zg{tchecker::zg::factory(system, tchecker::ts::SHARING, tchecker::zg::ELAPSED_SEMANTICS,
                                                               tchecker::zg::EXTRA_LU_PLUS_LOCAL, block_size, table_size)};

  std::shared_ptr<tchecker::tck_reach::zg_covreach::graph_t> graph{
      new tchecker::tck_reach::zg_covreach::graph_t{zg, block_size, table_size}};

  boost::dynamic_bitset<> accepting_labels = system->as_syncprod_system().labels(labels);

  enum tchecker::waiting::policy_t policy = tchecker::algorithms::fast_remove_waiting_policy(search_order);

  tchecker::algorithms::covreach::stats_t stats;
  tchecker::tck_reach::zg_covreach::algorithm_t algorithm;

  if (covering == tchecker::algorithms::covreach::COVERING_FULL)
    stats = algorithm.run<tchecker::algorithms::covreach::COVERING_FULL>(*zg, *graph, accepting_labels, policy);
  else if (covering == tchecker::algorithms::covreach::COVERING_LEAF_NODES)
    stats = algorithm.run<tchecker::algorithms::covreach::COVERING_LEAF_NODES>(*zg, *graph, accepting_labels, policy);
  else
    throw std::invalid_argument("Unknown covering policy for covreach algorithm");

  return std::make_tuple(stats, graph);
}